

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O2

void __thiscall
btRigidBody::setupRigidBody(btRigidBody *this,btRigidBodyConstructionInfo *constructionInfo)

{
  undefined4 uVar1;
  undefined4 uVar2;
  btMotionState *pbVar3;
  btScalar bVar4;
  btScalar bVar5;
  btScalar bVar6;
  undefined8 uVar7;
  int iVar8;
  btVector3 bVar9;
  
  (this->super_btCollisionObject).m_internalType = 2;
  (this->m_linearVelocity).m_floats[0] = 0.0;
  (this->m_linearVelocity).m_floats[1] = 0.0;
  (this->m_linearVelocity).m_floats[2] = 0.0;
  (this->m_linearVelocity).m_floats[3] = 0.0;
  (this->m_angularVelocity).m_floats[0] = 0.0;
  (this->m_angularVelocity).m_floats[1] = 0.0;
  (this->m_angularVelocity).m_floats[2] = 0.0;
  (this->m_angularVelocity).m_floats[3] = 0.0;
  (this->m_angularFactor).m_floats[0] = 1.0;
  (this->m_angularFactor).m_floats[1] = 1.0;
  (this->m_angularFactor).m_floats[2] = 1.0;
  (this->m_angularFactor).m_floats[3] = 0.0;
  (this->m_linearFactor).m_floats[0] = 1.0;
  (this->m_linearFactor).m_floats[1] = 1.0;
  (this->m_linearFactor).m_floats[2] = 1.0;
  *(undefined8 *)((this->m_linearFactor).m_floats + 3) = 0;
  (this->m_gravity).m_floats[1] = 0.0;
  (this->m_gravity).m_floats[2] = 0.0;
  *(undefined8 *)((this->m_gravity).m_floats + 3) = 0;
  (this->m_gravity_acceleration).m_floats[1] = 0.0;
  (this->m_gravity_acceleration).m_floats[2] = 0.0;
  (this->m_gravity_acceleration).m_floats[3] = 0.0;
  (this->m_totalForce).m_floats[0] = 0.0;
  (this->m_totalForce).m_floats[1] = 0.0;
  (this->m_totalForce).m_floats[2] = 0.0;
  (this->m_totalForce).m_floats[3] = 0.0;
  (this->m_totalTorque).m_floats[0] = 0.0;
  (this->m_totalTorque).m_floats[1] = 0.0;
  (this->m_totalTorque).m_floats[2] = 0.0;
  (this->m_totalTorque).m_floats[3] = 0.0;
  setDamping(this,constructionInfo->m_linearDamping,constructionInfo->m_angularDamping);
  bVar4 = constructionInfo->m_angularSleepingThreshold;
  this->m_linearSleepingThreshold = constructionInfo->m_linearSleepingThreshold;
  this->m_angularSleepingThreshold = bVar4;
  pbVar3 = constructionInfo->m_motionState;
  this->m_optionalMotionState = pbVar3;
  this->m_contactSolverType = 0;
  this->m_frictionSolverType = 0;
  this->m_additionalDamping = constructionInfo->m_additionalDamping;
  bVar4 = constructionInfo->m_additionalLinearDampingThresholdSqr;
  bVar5 = constructionInfo->m_additionalAngularDampingThresholdSqr;
  bVar6 = constructionInfo->m_additionalAngularDampingFactor;
  this->m_additionalDampingFactor = constructionInfo->m_additionalDampingFactor;
  this->m_additionalLinearDampingThresholdSqr = bVar4;
  this->m_additionalAngularDampingThresholdSqr = bVar5;
  this->m_additionalAngularDampingFactor = bVar6;
  if (pbVar3 == (btMotionState *)0x0) {
    uVar7 = *(undefined8 *)((constructionInfo->m_startWorldTransform).m_basis.m_el[0].m_floats + 2);
    *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats =
         *(undefined8 *)(constructionInfo->m_startWorldTransform).m_basis.m_el[0].m_floats;
    *(undefined8 *)((this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats + 2) =
         uVar7;
    uVar7 = *(undefined8 *)((constructionInfo->m_startWorldTransform).m_basis.m_el[1].m_floats + 2);
    *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats =
         *(undefined8 *)(constructionInfo->m_startWorldTransform).m_basis.m_el[1].m_floats;
    *(undefined8 *)((this->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats + 2) =
         uVar7;
    uVar7 = *(undefined8 *)((constructionInfo->m_startWorldTransform).m_basis.m_el[2].m_floats + 2);
    *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats =
         *(undefined8 *)(constructionInfo->m_startWorldTransform).m_basis.m_el[2].m_floats;
    *(undefined8 *)((this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats + 2) =
         uVar7;
    uVar7 = *(undefined8 *)((constructionInfo->m_startWorldTransform).m_origin.m_floats + 2);
    *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_origin.m_floats =
         *(undefined8 *)(constructionInfo->m_startWorldTransform).m_origin.m_floats;
    *(undefined8 *)((this->super_btCollisionObject).m_worldTransform.m_origin.m_floats + 2) = uVar7;
  }
  else {
    (*pbVar3->_vptr_btMotionState[2])(pbVar3,&(this->super_btCollisionObject).m_worldTransform);
  }
  uVar7 = *(undefined8 *)
           ((this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats + 2);
  *(undefined8 *)
   (this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[0].m_floats =
       *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_basis.m_el[0].m_floats;
  *(undefined8 *)
   ((this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[0].m_floats + 2) =
       uVar7;
  uVar7 = *(undefined8 *)
           ((this->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats + 2);
  *(undefined8 *)
   (this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[1].m_floats =
       *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_basis.m_el[1].m_floats;
  *(undefined8 *)
   ((this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[1].m_floats + 2) =
       uVar7;
  uVar7 = *(undefined8 *)
           ((this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats + 2);
  *(undefined8 *)
   (this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[2].m_floats =
       *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_basis.m_el[2].m_floats;
  *(undefined8 *)
   ((this->super_btCollisionObject).m_interpolationWorldTransform.m_basis.m_el[2].m_floats + 2) =
       uVar7;
  uVar7 = *(undefined8 *)((this->super_btCollisionObject).m_worldTransform.m_origin.m_floats + 2);
  *(undefined8 *)(this->super_btCollisionObject).m_interpolationWorldTransform.m_origin.m_floats =
       *(undefined8 *)(this->super_btCollisionObject).m_worldTransform.m_origin.m_floats;
  *(undefined8 *)
   ((this->super_btCollisionObject).m_interpolationWorldTransform.m_origin.m_floats + 2) = uVar7;
  (this->super_btCollisionObject).m_interpolationLinearVelocity.m_floats[0] = 0.0;
  (this->super_btCollisionObject).m_interpolationLinearVelocity.m_floats[1] = 0.0;
  (this->super_btCollisionObject).m_interpolationLinearVelocity.m_floats[2] = 0.0;
  (this->super_btCollisionObject).m_interpolationLinearVelocity.m_floats[3] = 0.0;
  (this->super_btCollisionObject).m_interpolationAngularVelocity.m_floats[0] = 0.0;
  (this->super_btCollisionObject).m_interpolationAngularVelocity.m_floats[1] = 0.0;
  (this->super_btCollisionObject).m_interpolationAngularVelocity.m_floats[2] = 0.0;
  (this->super_btCollisionObject).m_interpolationAngularVelocity.m_floats[3] = 0.0;
  (this->super_btCollisionObject).m_friction = constructionInfo->m_friction;
  uVar1 = constructionInfo->m_rollingFriction;
  uVar2 = constructionInfo->m_restitution;
  (this->super_btCollisionObject).m_restitution = (btScalar)uVar2;
  (this->super_btCollisionObject).m_rollingFriction = (btScalar)uVar1;
  (*(this->super_btCollisionObject)._vptr_btCollisionObject[2])
            (this,constructionInfo->m_collisionShape);
  iVar8 = uniqueId + 1;
  this->m_debugBodyId = uniqueId;
  uniqueId = iVar8;
  setMassProps(this,constructionInfo->m_mass,&constructionInfo->m_localInertia);
  updateInertiaTensor(this);
  this->m_rigidbodyFlags = 8;
  (this->m_deltaLinearVelocity).m_floats[0] = 0.0;
  (this->m_deltaLinearVelocity).m_floats[1] = 0.0;
  (this->m_deltaLinearVelocity).m_floats[2] = 0.0;
  (this->m_deltaLinearVelocity).m_floats[3] = 0.0;
  (this->m_deltaAngularVelocity).m_floats[0] = 0.0;
  (this->m_deltaAngularVelocity).m_floats[1] = 0.0;
  (this->m_deltaAngularVelocity).m_floats[2] = 0.0;
  (this->m_deltaAngularVelocity).m_floats[3] = 0.0;
  bVar9 = operator*(&this->m_linearFactor,&this->m_inverseMass);
  *&(this->m_invMass).m_floats = bVar9.m_floats;
  (this->m_pushVelocity).m_floats[0] = 0.0;
  (this->m_pushVelocity).m_floats[1] = 0.0;
  (this->m_pushVelocity).m_floats[2] = 0.0;
  (this->m_pushVelocity).m_floats[3] = 0.0;
  (this->m_turnVelocity).m_floats[0] = 0.0;
  (this->m_turnVelocity).m_floats[1] = 0.0;
  (this->m_turnVelocity).m_floats[2] = 0.0;
  (this->m_turnVelocity).m_floats[3] = 0.0;
  return;
}

Assistant:

void	btRigidBody::setupRigidBody(const btRigidBody::btRigidBodyConstructionInfo& constructionInfo)
{

	m_internalType=CO_RIGID_BODY;

	m_linearVelocity.setValue(btScalar(0.0), btScalar(0.0), btScalar(0.0));
	m_angularVelocity.setValue(btScalar(0.),btScalar(0.),btScalar(0.));
	m_angularFactor.setValue(1,1,1);
	m_linearFactor.setValue(1,1,1);
	m_gravity.setValue(btScalar(0.0), btScalar(0.0), btScalar(0.0));
	m_gravity_acceleration.setValue(btScalar(0.0), btScalar(0.0), btScalar(0.0));
	m_totalForce.setValue(btScalar(0.0), btScalar(0.0), btScalar(0.0));
	m_totalTorque.setValue(btScalar(0.0), btScalar(0.0), btScalar(0.0)),
    setDamping(constructionInfo.m_linearDamping, constructionInfo.m_angularDamping);

	m_linearSleepingThreshold = constructionInfo.m_linearSleepingThreshold;
	m_angularSleepingThreshold = constructionInfo.m_angularSleepingThreshold;
	m_optionalMotionState = constructionInfo.m_motionState;
	m_contactSolverType = 0;
	m_frictionSolverType = 0;
	m_additionalDamping = constructionInfo.m_additionalDamping;
	m_additionalDampingFactor = constructionInfo.m_additionalDampingFactor;
	m_additionalLinearDampingThresholdSqr = constructionInfo.m_additionalLinearDampingThresholdSqr;
	m_additionalAngularDampingThresholdSqr = constructionInfo.m_additionalAngularDampingThresholdSqr;
	m_additionalAngularDampingFactor = constructionInfo.m_additionalAngularDampingFactor;

	if (m_optionalMotionState)
	{
		m_optionalMotionState->getWorldTransform(m_worldTransform);
	} else
	{
		m_worldTransform = constructionInfo.m_startWorldTransform;
	}

	m_interpolationWorldTransform = m_worldTransform;
	m_interpolationLinearVelocity.setValue(0,0,0);
	m_interpolationAngularVelocity.setValue(0,0,0);
	
	//moved to btCollisionObject
	m_friction = constructionInfo.m_friction;
	m_rollingFriction = constructionInfo.m_rollingFriction;
	m_restitution = constructionInfo.m_restitution;

	setCollisionShape( constructionInfo.m_collisionShape );
	m_debugBodyId = uniqueId++;
	
	setMassProps(constructionInfo.m_mass, constructionInfo.m_localInertia);
	updateInertiaTensor();

	m_rigidbodyFlags = BT_ENABLE_GYROSCOPIC_FORCE_IMPLICIT_BODY;


	m_deltaLinearVelocity.setZero();
	m_deltaAngularVelocity.setZero();
	m_invMass = m_inverseMass*m_linearFactor;
	m_pushVelocity.setZero();
	m_turnVelocity.setZero();

	

}